

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O2

int ExUtilInitCommandLineArguments(int argc,char **argv,CommandLineArguments *args)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  uint8_t *__s;
  long lVar4;
  
  if (argv == (char **)0x0 || args == (CommandLineArguments *)0x0) {
    return 0;
  }
  args->argc_ = argc;
  args->argv_ = argv;
  args->own_argv_ = 0;
  (args->argv_data_).bytes = (uint8_t *)0x0;
  (args->argv_data_).size = 0;
  if ((argc == 1) && (**argv != '-')) {
    iVar1 = ExUtilReadFileToWebPData(*argv,&args->argv_data_);
    if (iVar1 == 0) {
      return 0;
    }
    args->own_argv_ = 1;
    ppcVar2 = (char **)WebPMalloc(0x20000);
    args->argv_ = ppcVar2;
    if (ppcVar2 == (char **)0x0) {
LAB_001045a8:
      ExUtilDeleteCommandLineArguments(args);
      return 0;
    }
    __s = (args->argv_data_).bytes;
    lVar4 = 0;
    while (pcVar3 = strtok((char *)__s," \t\r\n\f\v"), pcVar3 != (char *)0x0) {
      if (lVar4 == 0x4000) {
        fprintf(_stderr,"ERROR: Arguments limit %d reached\n",0x4000);
        goto LAB_001045a8;
      }
      args->argv_[lVar4] = pcVar3;
      lVar4 = lVar4 + 1;
      __s = (uint8_t *)0x0;
    }
    args->argc_ = (int)lVar4;
  }
  return 1;
}

Assistant:

int ExUtilInitCommandLineArguments(int argc, const char* argv[],
                                   CommandLineArguments* const args) {
  if (args == NULL || argv == NULL) return 0;
  ResetCommandLineArguments(argc, argv, args);
  if (argc == 1 && argv[0][0] != '-') {
    char* cur;
    const char sep[] = " \t\r\n\f\v";

#if defined(_WIN32) && defined(_UNICODE)
    fprintf(stderr,
            "Error: Reading arguments from a file is a feature unavailable "
            "with Unicode binaries.\n");
    return 0;
#endif

    if (!ExUtilReadFileToWebPData(argv[0], &args->argv_data_)) {
      return 0;
    }
    args->own_argv_ = 1;
    args->argv_ = (const char**)WebPMalloc(MAX_ARGC * sizeof(*args->argv_));
    if (args->argv_ == NULL) {
      ExUtilDeleteCommandLineArguments(args);
      return 0;
    }

    argc = 0;
    for (cur = strtok((char*)args->argv_data_.bytes, sep);
         cur != NULL;
         cur = strtok(NULL, sep)) {
      if (argc == MAX_ARGC) {
        fprintf(stderr, "ERROR: Arguments limit %d reached\n", MAX_ARGC);
        ExUtilDeleteCommandLineArguments(args);
        return 0;
      }
      assert(strlen(cur) != 0);
      args->argv_[argc++] = cur;
    }
    args->argc_ = argc;
  }
  return 1;
}